

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O0

avl_node_t * avl_rotate_LL(avl_node_t *parent)

{
  avl_node_t *node;
  avl_node_t *child;
  avl_node_t *parent_local;
  
  node = parent->left;
  parent->left = node->right;
  node->right = parent;
  avl_update_height(parent);
  avl_update_height(node);
  return node;
}

Assistant:

static avl_node_t*
avl_rotate_LL(avl_node_t *parent)
{
    avl_node_t *child = parent->left;
    parent->left = child->right;
    child->right = parent;
    avl_update_height(parent);
    avl_update_height(child);
    return child;
}